

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  int iVar1;
  int *piVar2;
  void *in_RCX;
  char *in_RDX;
  long in_RSI;
  uv_req_t *in_RDI;
  bool bVar3;
  int r;
  int err;
  int new_sock;
  sockaddr_un saddr;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  int local_98;
  sockaddr local_8e [6];
  undefined1 local_21;
  void *local_20;
  char *local_18;
  long local_10;
  uv_req_t *local_8;
  
  bVar3 = *(int *)(in_RSI + 0xa0) == -1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (bVar3) {
    local_98 = uv__socket(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58);
    if (local_98 < 0) goto LAB_001124e2;
    *(int *)(local_10 + 0xa0) = local_98;
  }
  memset(local_8e,0,0x6e);
  strncpy(local_8e[0].sa_data,local_18,0x6b);
  local_21 = 0;
  local_8e[0].sa_family = 1;
  do {
    iVar1 = connect(*(int *)(local_10 + 0xa0),local_8e,0x6e);
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 & 0xffffff;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      in_stack_ffffffffffffff60 = CONCAT13(*piVar2 == 4,(int3)in_stack_ffffffffffffff60);
    }
  } while ((char)(in_stack_ffffffffffffff60 >> 0x18) != '\0');
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0x73)) {
    piVar2 = __errno_location();
    local_98 = -*piVar2;
  }
  else {
    local_98 = 0;
    if (bVar3) {
      local_98 = uv__stream_open((uv_stream_t *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0,
                                 0x1124b3);
    }
    if (local_98 == 0) {
      uv__io_start((uv_loop_t *)CONCAT44(iVar1,in_stack_ffffffffffffff60),
                   (uv__io_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
    }
  }
LAB_001124e2:
  *(int *)(local_10 + 0xd0) = local_98;
  *(uv_req_t **)(local_10 + 0x60) = local_8;
  uv__req_init(*(uv_loop_t **)(local_10 + 0x10),local_8,UV_CONNECT);
  *(long *)&local_8[1].type = local_10;
  local_8[1].data = local_20;
  local_8[1].active_queue[0] = local_8[1].active_queue;
  local_8[1].active_queue[1] = local_8[1].active_queue;
  if (local_98 != 0) {
    uv__io_feed(*(uv_loop_t **)(local_10 + 0x10),(uv__io_t *)(local_10 + 0x70));
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;

  new_sock = (uv__stream_fd(handle) == -1);
  err = -EINVAL;

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  strncpy(saddr.sun_path, name, sizeof(saddr.sun_path) - 1);
  saddr.sun_path[sizeof(saddr.sun_path) - 1] = '\0';
  saddr.sun_family = AF_UNIX;

  do {
    r = connect(uv__stream_fd(handle),
                (struct sockaddr*)&saddr, sizeof saddr);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = -errno;
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_STREAM_READABLE | UV_STREAM_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, UV__POLLIN | UV__POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*)handle;
  req->cb = cb;
  QUEUE_INIT(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

  /* Mimic the Windows pipe implementation, always
   * return 0 and let the callback handle errors.
   */
}